

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushUnaryMinus.cpp
# Opt level: O2

ostream * Inferences::operator<<(ostream *out,UMinus *self)

{
  ostream *poVar1;
  
  if ((ulong)*self < 4) {
    poVar1 = std::operator<<(out,&DAT_0073db84 + *(int *)(&DAT_0073db84 + (ulong)*self * 4));
    return poVar1;
  }
  poVar1 = std::operator<<(out,"UNKNOWN");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, UMinus const& self) {
  switch(self) {
    case UMinus::Int: return out << "UMinus::Int";
    case UMinus::Rat: return out << "UMinus::Rat";
    case UMinus::Real: return out << "UMinus::Real";
    case UMinus::None: return out << "UMinus::None";
    default:
      return out << "UNKNOWN";
  }
  ASSERTION_VIOLATION
}